

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_array_name(Integer g_a,char *array_name)

{
  size_t sVar1;
  
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set array name on array that has been allocated",0);
  }
  sVar1 = strlen(array_name);
  if (0x1f < sVar1) {
    pnga_error("Array name exceeds maximum array name length",0x1f);
  }
  strcpy(GA[g_a + 1000].name,array_name);
  return;
}

Assistant:

void pnga_set_array_name(Integer g_a, char *array_name)
{
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set array name on array that has been allocated",0);
  if (strlen(array_name) > FNAM)
    pnga_error("Array name exceeds maximum array name length",FNAM);
  strcpy(GA[ga_handle].name, array_name);
}